

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O1

int * __thiscall MeCab::ChunkFreeList<int>::alloc(ChunkFreeList<int> *this,size_t req)

{
  pointer *pppVar1;
  pointer ppVar2;
  iterator __position;
  int *piVar3;
  size_t sVar4;
  ulong uVar5;
  int **ppiVar6;
  ulong uVar7;
  pair<unsigned_long,_int_*> local_30;
  
  ppVar2 = (this->freelist_).
           super__Vector_base<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->freelist_).
       super__Vector_base<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  uVar5 = (long)__position._M_current - (long)ppVar2 >> 4;
  uVar7 = this->li_;
  if (uVar7 < uVar5) {
    sVar4 = this->pi_;
    ppiVar6 = &ppVar2[uVar7].second;
    do {
      uVar7 = uVar7 + 1;
      if (sVar4 + req < ((pair<unsigned_long,_int_*> *)(ppiVar6 + -1))->first) {
        piVar3 = *ppiVar6;
        this->pi_ = sVar4 + req;
        return piVar3 + sVar4;
      }
      this->li_ = uVar7;
      this->pi_ = 0;
      ppiVar6 = ppiVar6 + 2;
      sVar4 = 0;
    } while (uVar7 != uVar5);
  }
  uVar7 = this->default_size;
  if (this->default_size <= req) {
    uVar7 = req;
  }
  local_30.second = (int *)operator_new__(-(ulong)(uVar7 >> 0x3e != 0) | uVar7 * 4);
  if (__position._M_current ==
      (this->freelist_).
      super__Vector_base<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_30.first = uVar7;
    std::vector<std::pair<unsigned_long,int*>,std::allocator<std::pair<unsigned_long,int*>>>::
    _M_realloc_insert<std::pair<unsigned_long,int*>>
              ((vector<std::pair<unsigned_long,int*>,std::allocator<std::pair<unsigned_long,int*>>>
                *)&this->freelist_,__position,&local_30);
  }
  else {
    (__position._M_current)->first = uVar7;
    (__position._M_current)->second = local_30.second;
    pppVar1 = &(this->freelist_).
               super__Vector_base<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + 1;
  }
  ppVar2 = (this->freelist_).
           super__Vector_base<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar4 = ((long)(this->freelist_).
                 super__Vector_base<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2 >> 4) - 1;
  this->li_ = sVar4;
  this->pi_ = this->pi_ + req;
  return ppVar2[sVar4].second;
}

Assistant:

T* alloc(size_t req = 1) {
    while (li_ < freelist_.size()) {
      if ((pi_ + req) < freelist_[li_].first) {
        T *r = freelist_[li_].second + pi_;
        pi_ += req;
        return r;
      }
      li_++;
      pi_ = 0;
    }
    size_t _size = std::max(req, default_size);
    freelist_.push_back(std::make_pair(_size, new T[_size]));
    li_ = freelist_.size() - 1;
    pi_ += req;
    return freelist_[li_].second;
  }